

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O2

void __thiscall antlr::Parser::match(Parser *this,int t)

{
  int iVar1;
  int numTokens_;
  ostream *poVar2;
  MismatchedTokenException *this_00;
  undefined4 extraout_var;
  RefToken local_58;
  string local_50;
  
  if (DEBUG_PARSER == '\x01') {
    (*this->_vptr_Parser[0x1b])(this);
    poVar2 = std::operator<<((ostream *)&std::cout,"enter match(");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,t);
    poVar2 = std::operator<<(poVar2,") with LA(1)=");
    iVar1 = (*this->_vptr_Parser[2])(this,1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  iVar1 = (*this->_vptr_Parser[2])(this,1);
  if (iVar1 == t) {
    (*this->_vptr_Parser[0xc])(this);
    return;
  }
  if (DEBUG_PARSER == '\x01') {
    (*this->_vptr_Parser[0x1b])(this);
    poVar2 = std::operator<<((ostream *)&std::cout,"token mismatch: ");
    iVar1 = (*this->_vptr_Parser[2])(this,1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,"!=");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,t);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  this_00 = (MismatchedTokenException *)__cxa_allocate_exception(200);
  iVar1 = (*this->_vptr_Parser[0x19])(this);
  numTokens_ = (*this->_vptr_Parser[0x1a])(this);
  (*this->_vptr_Parser[3])(&local_58,this,1);
  (*this->_vptr_Parser[8])(&local_50,this);
  MismatchedTokenException::MismatchedTokenException
            (this_00,(char **)CONCAT44(extraout_var,iVar1),numTokens_,&local_58,t,false,&local_50);
  __cxa_throw(this_00,&MismatchedTokenException::typeinfo,
              MismatchedTokenException::~MismatchedTokenException);
}

Assistant:

virtual void match(int t)
	{
		if ( DEBUG_PARSER )
		{
			traceIndent();
			ANTLR_USE_NAMESPACE(std)cout << "enter match(" << t << ") with LA(1)=" << LA(1) << ANTLR_USE_NAMESPACE(std)endl;
		}
		if ( LA(1) != t )
		{
			if ( DEBUG_PARSER )
			{
				traceIndent();
				ANTLR_USE_NAMESPACE(std)cout << "token mismatch: " << LA(1) << "!=" << t << ANTLR_USE_NAMESPACE(std)endl;
			}
			throw MismatchedTokenException(getTokenNames(), getNumTokens(), LT(1), t, false, getFilename());
		}
		else
		{
			// mark token as consumed -- fetch next token deferred until LA/LT
			consume();
		}
	}